

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

char * __thiscall TiXmlElement::Attribute(TiXmlElement *this,char *name,double *d)

{
  int iVar1;
  TiXmlAttribute *pTVar2;
  char *pcVar3;
  
  pTVar2 = &(this->attributeSet).sentinel;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &(this->attributeSet).sentinel) {
      pTVar2 = (TiXmlAttribute *)0x0;
      break;
    }
    iVar1 = strcmp(((pTVar2->name).rep_)->str,name);
  } while (iVar1 != 0);
  if (pTVar2 == (TiXmlAttribute *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = ((pTVar2->value).rep_)->str;
    if (d != (double *)0x0) {
      __isoc99_sscanf(pcVar3,"%lf",d);
    }
  }
  return pcVar3;
}

Assistant:

const char* TiXmlElement::Attribute( const char* name, double* d ) const
{
	const TiXmlAttribute* attrib = attributeSet.Find( name );
	const char* result = 0;

	if ( attrib ) {
		result = attrib->Value();
		if ( d ) {
			attrib->QueryDoubleValue( d );
		}
	}
	return result;
}